

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseNot(SelectionCompiler *this)

{
  bool bVar1;
  int iVar2;
  SelectionCompiler *in_RDI;
  Token tokenNot;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  SelectionCompiler *in_stack_ffffffffffffffd8;
  SelectionCompiler *in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  iVar2 = tokPeek((SelectionCompiler *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                 );
  if (iVar2 == 0x405) {
    tokenNext(in_stack_ffffffffffffffd8);
    bVar1 = clauseNot(in_stack_ffffffffffffffe8);
    if (bVar1) {
      local_1 = addTokenToPostfix(in_RDI,(Token *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffbe,
                                                                          in_stack_ffffffffffffffb8)
                                                          ));
    }
    else {
      local_1 = false;
    }
    Token::~Token((Token *)0x3dda16);
  }
  else {
    local_1 = clausePrimitive(this);
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::clauseNot() {
    if (tokPeek() == Token::opNot) {
      Token tokenNot = tokenNext();
      if (!clauseNot()) { return false; }
      return addTokenToPostfix(tokenNot);
    }
    return clausePrimitive();
  }